

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::tonk_status_ex(Connection *this,TonkStatusEx *statusEx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *in_RSI;
  Locker *in_RDI;
  ReceiverStatistics RVar8;
  ReceiverStatistics receiverStats;
  Locker locker;
  TonkStatusEx *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_24;
  float fStack_20;
  undefined8 local_10;
  
  *in_RSI = in_RDI[0x191f].TheLock;
  local_10 = in_RSI;
  Locker::Locker(in_RDI,(Lock *)&stack0xffffffffffffffe8);
  uVar1 = *(undefined8 *)((long)&in_RDI[0x1917].TheLock + 4);
  uVar2 = *(undefined8 *)((long)&in_RDI[0x1918].TheLock + 4);
  uVar3 = *(undefined8 *)((long)&in_RDI[0x1919].TheLock + 4);
  uVar4 = *(undefined8 *)((long)&in_RDI[0x191a].TheLock + 4);
  uVar5 = *(undefined8 *)((long)&in_RDI[0x1919].TheLock + 6);
  uVar6 = *(undefined8 *)((long)&in_RDI[0x191a].TheLock + 6);
  uVar7 = *(undefined8 *)((long)&in_RDI[0x191b].TheLock + 6);
  *(undefined8 *)(local_10 + 0x12) = *(undefined8 *)((long)&in_RDI[0x1918].TheLock + 6);
  *(undefined8 *)(local_10 + 0x1a) = uVar5;
  *(undefined8 *)(local_10 + 0x22) = uVar6;
  *(undefined8 *)(local_10 + 0x2a) = uVar7;
  *(undefined8 *)(local_10 + 8) = uVar1;
  *(undefined8 *)(local_10 + 0x10) = uVar2;
  *(undefined8 *)(local_10 + 0x18) = uVar3;
  *(undefined8 *)(local_10 + 0x20) = uVar4;
  *(undefined4 *)(local_10 + 0x60) = *(undefined4 *)((long)&in_RDI[0x1920].TheLock + 4);
  *(undefined4 *)(local_10 + 0x68) = *(undefined4 *)((long)&in_RDI[0x191d].TheLock + 4);
  *(undefined4 *)(local_10 + 100) = *(undefined4 *)&in_RDI[0x191d].TheLock;
  *(undefined4 *)(local_10 + 0x6c) = *(undefined4 *)&in_RDI[0x191e].TheLock;
  *(undefined2 *)(local_10 + 0x5e) = *(undefined2 *)((long)&in_RDI[0x1921].TheLock + 2);
  *(undefined2 *)(local_10 + 0x5c) = *(undefined2 *)&in_RDI[0x1921].TheLock;
  Locker::~Locker((Locker *)0x143348);
  SessionOutgoing::tonk_status_ex
            ((SessionOutgoing *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  RVar8 = ReceiverBandwidthControl::GetStatistics
                    ((ReceiverBandwidthControl *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  local_24 = RVar8.GoodputBPS;
  *(uint *)(local_10 + 0x70) = local_24;
  fStack_20 = RVar8.LossRate;
  *(float *)(local_10 + 0x74) = fStack_20;
  *(uint *)(local_10 + 0x78) = RVar8.TripUsec;
  return;
}

Assistant:

void Connection::tonk_status_ex(TonkStatusEx& statusEx)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    TONK_DEBUG_ASSERT(SelfRefCount.DoesAppHoldReference());

    statusEx.ConnectionKey = EncryptionKey; // Set during Initialize() - safe

    //--------------------------------------------------------------------------
    // API Lock
    {
        Locker locker(PublicAPILock);

        // Fill in local address
        statusEx.Local = CachedLocalAddress;
        statusEx.RemoteAssignedIdForLocalHost = RemoteAssignedIdForLocalHost;

        // Fill in peer receiver stats from the last TimeSync message
        statusEx.PeerSeenLossRate = CachedReceiverStats.LossRate;
        statusEx.PeerSeenBPS = CachedReceiverStats.GoodputBPS;
        statusEx.PeerTripUsec = CachedReceiverStats.TripUsec;

        // Fill in NAT map state
        statusEx.RemoteNATMapExternalPort = RemoteNATMapExternalPort;
        statusEx.LocalNATMapExternalPort = LocalNATMapExternalPort;
    }
    //--------------------------------------------------------------------------

    Outgoing.tonk_status_ex(statusEx);

    // Fill in local receiver stats
    const ReceiverStatistics receiverStats = ReceiverControl.GetStatistics();
    statusEx.IncomingBPS = receiverStats.GoodputBPS;
    statusEx.IncomingLossRate = receiverStats.LossRate;
    statusEx.TripUsec = receiverStats.TripUsec;
}